

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall GlobOpt::CollectMemOpLdElementI(GlobOpt *this,Instr *instr,Loop *loop)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  
  if (instr->m_opcode != LdElemI_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x85d,"(instr->m_opcode == Js::OpCode::LdElemI_A)",
                       "instr->m_opcode == Js::OpCode::LdElemI_A");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,MemCopyPhase,sourceContextId,functionId);
  if (bVar2) {
    return false;
  }
  bVar2 = CollectMemcopyLdElementI(this,instr,loop);
  return bVar2;
}

Assistant:

bool
GlobOpt::CollectMemOpLdElementI(IR::Instr *instr, Loop *loop)
{
    Assert(instr->m_opcode == Js::OpCode::LdElemI_A);
    return (!PHASE_OFF(Js::MemCopyPhase, this->func) && CollectMemcopyLdElementI(instr, loop));
}